

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O3

void __thiscall QuadList<SSTableDataEntry>::~QuadList(QuadList<SSTableDataEntry> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NodePosi pQVar2;
  pointer pcVar3;
  
  this->_vptr_QuadList = (_func_int **)&PTR__QuadList_0010fce8;
  if (this->_size != 0) {
    clear(this);
  }
  pQVar2 = this->header;
  if (pQVar2 != (NodePosi)0x0) {
    pcVar3 = (pQVar2->data).value._M_dataplus._M_p;
    paVar1 = &(pQVar2->data).value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pQVar2,0x60);
  pQVar2 = this->trailer;
  if (pQVar2 != (NodePosi)0x0) {
    pcVar3 = (pQVar2->data).value._M_dataplus._M_p;
    paVar1 = &(pQVar2->data).value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pQVar2,0x60);
  return;
}

Assistant:

QuadList<T>::~QuadList() {
    if (!empty())
        clear();
    delete header;
    delete trailer;
}